

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall Search::predictor::set_input(predictor *this,example *input_example)

{
  free_ec(this);
  this->is_ldf = false;
  this->ec = input_example;
  this->ec_cnt = 1;
  this->ec_alloced = false;
  return this;
}

Assistant:

predictor& predictor::set_input(example& input_example)
{
  free_ec();
  is_ldf = false;
  ec = &input_example;
  ec_cnt = 1;
  ec_alloced = false;
  return *this;
}